

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

bool GetDealSpecificMove(int card_index,int player,int color,int rank,pyhanabi_move_t *move)

{
  HanabiMove *this;
  int8_t in_CL;
  int8_t in_DL;
  int8_t in_SIL;
  int8_t in_DIL;
  long *in_R8;
  
  if (in_R8 != (long *)0x0) {
    this = (HanabiMove *)operator_new(8);
    hanabi_learning_env::HanabiMove::HanabiMove(this,kDealSpecific,in_DIL,in_SIL,in_DL,in_CL);
    *in_R8 = (long)this;
    return *in_R8 != 0;
  }
  __assert_fail("move != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0xbf,"bool GetDealSpecificMove(int, int, int, int, pyhanabi_move_t *)");
}

Assistant:

bool GetDealSpecificMove(int card_index, int player, int color, int rank, pyhanabi_move_t* move) {
  REQUIRE(move != nullptr);
  move->move = new hanabi_learning_env::HanabiMove(
      hanabi_learning_env::HanabiMove::kDealSpecific, card_index, player, color, rank);
  return move->move != nullptr;
}